

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cc
# Opt level: O3

bool __thiscall tchecker::zg::zone_t::operator==(zone_t *this,zone_t *zone)

{
  bool bVar1;
  bool bVar2;
  
  if (this->_dim == zone->_dim) {
    bVar1 = tchecker::dbm::is_empty_0((db_t *)(this + 1),this->_dim);
    bVar2 = tchecker::dbm::is_empty_0((db_t *)(zone + 1),zone->_dim);
    if (!bVar1 && !bVar2) {
      bVar1 = tchecker::dbm::is_equal((db_t *)(this + 1),(db_t *)(zone + 1),this->_dim);
      return bVar1;
    }
    bVar1 = bVar1 && bVar2;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool zone_t::operator==(tchecker::zg::zone_t const & zone) const
{
  if (_dim != zone._dim)
    return false;
  bool empty1 = this->is_empty(), empty2 = zone.is_empty();
  if (empty1 || empty2)
    return (empty1 && empty2);
  return tchecker::dbm::is_equal(dbm_ptr(), zone.dbm_ptr(), _dim);
}